

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollController.cpp
# Opt level: O2

void __thiscall
Rml::ScrollController::UpdateAutoscroll
          (ScrollController *this,Vector2i mouse_position,float dp_ratio)

{
  code *pcVar1;
  bool bVar2;
  float fVar3;
  Vector2f target_delta;
  Vector2f scroll_length_integral;
  Vector2f local_40;
  Vector2f local_38;
  float local_28;
  
  local_38.x = dp_ratio;
  if ((this->mode != Autoscroll) || (this->target == (Element *)0x0)) {
    bVar2 = Assert("RMLUI_ASSERT(mode == Mode::Autoscroll && target)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ScrollController.cpp"
                   ,0x8a);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  local_28 = UpdateTime(this);
  target_delta.x = (float)(mouse_position.x - (this->autoscroll_start_position).x);
  target_delta.y = (float)(mouse_position.y - (this->autoscroll_start_position).y);
  local_38 = CalculateAutoscrollVelocity(target_delta,local_38.x);
  local_40.x = (this->autoscroll_accumulated_length).x + local_28 * local_38.x;
  local_40.y = (this->autoscroll_accumulated_length).y + local_28 * local_38.y;
  this->autoscroll_accumulated_length = local_40;
  fVar3 = Math::DecomposeFractionalIntegral(local_40.x,&local_40.x);
  (this->autoscroll_accumulated_length).x = fVar3;
  fVar3 = Math::DecomposeFractionalIntegral((this->autoscroll_accumulated_length).y,&local_40.y);
  (this->autoscroll_accumulated_length).y = fVar3;
  if ((((local_38.x != 0.0) || (NAN(local_38.x))) || (local_38.y != 0.0)) || (NAN(local_38.y))) {
    this->autoscroll_moved = true;
  }
  PerformScrollOnTarget(this,local_40);
  return;
}

Assistant:

void ScrollController::UpdateAutoscroll(Vector2i mouse_position, float dp_ratio)
{
	RMLUI_ASSERT(mode == Mode::Autoscroll && target);

	const float dt = UpdateTime();

	const Vector2f scroll_delta = Vector2f(mouse_position - autoscroll_start_position);
	const Vector2f scroll_velocity = CalculateAutoscrollVelocity(scroll_delta, dp_ratio);

	autoscroll_accumulated_length += scroll_velocity * dt;

	// Only submit the integer part of the scroll length, accumulate and store fractional parts to enable sub-pixel-per-frame scrolling speeds.
	Vector2f scroll_length_integral = autoscroll_accumulated_length;
	autoscroll_accumulated_length.x = Math::DecomposeFractionalIntegral(autoscroll_accumulated_length.x, &scroll_length_integral.x);
	autoscroll_accumulated_length.y = Math::DecomposeFractionalIntegral(autoscroll_accumulated_length.y, &scroll_length_integral.y);

	if (scroll_velocity != Vector2f(0.f))
		autoscroll_moved = true;

	PerformScrollOnTarget(scroll_length_integral);
}